

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SpreadArrayArgs
              (Var arrayToSpread,AuxArray<unsigned_int> *spreadIndices,ScriptContext *scriptContext)

{
  uint end;
  code *pcVar1;
  bool bVar2;
  uint32 end_00;
  int iVar3;
  uint32 uVar4;
  uint uVar5;
  BOOL BVar6;
  ThreadContext *threadContext;
  JavascriptArray *srcArray;
  undefined4 extraout_var;
  Var pvVar7;
  JavascriptArray *this;
  undefined4 extraout_var_00;
  SpreadArgument *this_00;
  Var *ppvVar8;
  undefined4 *puVar9;
  uint local_bc;
  uint32 j;
  Var *spreadItems;
  uint32 len;
  SpreadArgument *spreadArgument;
  Var instance;
  anon_class_16_2_4d2d011e slowCopy;
  anon_class_8_1_9014563a needArraySlowCopy;
  uint32 spreadIndex;
  uint resultIndex;
  uint spreadArrIndex;
  uint i_1;
  JavascriptArray *result;
  uint32 local_60;
  uint i;
  uint32 actualLength;
  uint32 arrayLength;
  JavascriptArray *array;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  AuxArray<unsigned_int> *spreadIndices_local;
  Var arrayToSpread_local;
  
  jsReentLock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_40,arrayToSpread);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(arrayToSpread);
  srcArray = VarTo<Js::JavascriptArray>(arrayToSpread);
  end_00 = ArrayObject::GetLength(&srcArray->super_ArrayObject);
  local_60 = end_00;
  for (result._4_4_ = 0; result._4_4_ < spreadIndices->count; result._4_4_ = result._4_4_ + 1) {
    JsReentLock::unlock((JsReentLock *)local_40);
    iVar3 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(srcArray,(ulong)spreadIndices[(ulong)result._4_4_ + 1].count);
    uVar4 = GetSpreadArgLen((Var)CONCAT44(extraout_var,iVar3),(ScriptContext *)jsReentLock._24_8_);
    local_60 = UInt32Math::Add(local_60 - 1,uVar4);
    JsReentLock::MutateArrayObject((JsReentLock *)local_40);
    JsReentLock::relock((JsReentLock *)local_40);
  }
  pvVar7 = OP_NewScArrayWithMissingValues(local_60,(ScriptContext *)jsReentLock._24_8_);
  this = VarTo<Js::JavascriptArray>(pvVar7);
  resultIndex = 0;
  spreadIndex = 0;
  needArraySlowCopy.jsReentLock._4_4_ = 0;
  do {
    if (end_00 <= resultIndex || local_60 <= needArraySlowCopy.jsReentLock._4_4_) {
LAB_010e2d3c:
      uVar4 = ArrayObject::GetLength(&srcArray->super_ArrayObject);
      if (end_00 != uVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e14,"(arrayLength == array->GetLength())",
                                    "Array\'s length should not have changed");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      JsReentLock::~JsReentLock((JsReentLock *)local_40);
      return this;
    }
    end = spreadIndices[(ulong)spreadIndex + 1].count;
    slowCopy.needArraySlowCopy = (anon_class_8_1_9014563a *)local_40;
    instance = &jsReentLock.m_savedNoJsReentrancy;
    slowCopy.scriptContext = (ScriptContext **)&slowCopy.needArraySlowCopy;
    if (resultIndex < end) {
      bVar2 = SpreadArrayArgs::anon_class_8_1_9014563a::operator()
                        ((anon_class_8_1_9014563a *)&slowCopy.needArraySlowCopy,srcArray);
      if (bVar2) {
        SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                  ((anon_class_16_2_4d2d011e *)&instance,this,needArraySlowCopy.jsReentLock._4_4_,
                   srcArray,resultIndex,end);
      }
      else {
        JsReentLock::unlock((JsReentLock *)local_40);
        CopyAnyArrayElementsToVar<unsigned_int>
                  (this,needArraySlowCopy.jsReentLock._4_4_,srcArray,resultIndex,end);
        JsReentLock::MutateArrayObject((JsReentLock *)local_40);
        JsReentLock::relock((JsReentLock *)local_40);
      }
      needArraySlowCopy.jsReentLock._4_4_ =
           (end - resultIndex) + needArraySlowCopy.jsReentLock._4_4_;
      resultIndex = end - 1;
    }
    else {
      if (end < resultIndex) {
        if (spreadIndex != spreadIndices->count - 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2dee,"(spreadArrIndex == spreadIndices->count - 1)",
                                      "spreadArrIndex == spreadIndices->count - 1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        bVar2 = SpreadArrayArgs::anon_class_8_1_9014563a::operator()
                          ((anon_class_8_1_9014563a *)&slowCopy.needArraySlowCopy,srcArray);
        if (bVar2) {
          SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                    ((anon_class_16_2_4d2d011e *)&instance,this,needArraySlowCopy.jsReentLock._4_4_,
                     srcArray,resultIndex,end_00);
        }
        else {
          JsReentLock::unlock((JsReentLock *)local_40);
          CopyAnyArrayElementsToVar<unsigned_int>
                    (this,needArraySlowCopy.jsReentLock._4_4_,srcArray,resultIndex,end_00);
          JsReentLock::MutateArrayObject((JsReentLock *)local_40);
          JsReentLock::relock((JsReentLock *)local_40);
        }
        goto LAB_010e2d3c;
      }
      JsReentLock::unlock((JsReentLock *)local_40);
      iVar3 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(srcArray,(ulong)resultIndex);
      pvVar7 = (Var)CONCAT44(extraout_var_00,iVar3);
      JsReentLock::MutateArrayObject((JsReentLock *)local_40);
      JsReentLock::relock((JsReentLock *)local_40);
      bVar2 = VarIs<Js::SpreadArgument>(pvVar7);
      if (bVar2) {
        this_00 = VarTo<Js::SpreadArgument>(pvVar7);
        uVar5 = SpreadArgument::GetArgumentSpreadCount(this_00);
        ppvVar8 = SpreadArgument::GetArgumentSpread(this_00);
        for (local_bc = 0; local_bc < uVar5; local_bc = local_bc + 1) {
          DirectSetItemAt<void*>(this,needArraySlowCopy.jsReentLock._4_4_,ppvVar8[local_bc]);
          needArraySlowCopy.jsReentLock._4_4_ = needArraySlowCopy.jsReentLock._4_4_ + 1;
        }
      }
      else {
        BVar6 = Js::JavascriptOperators::IsUndefinedObject(pvVar7);
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2e0a,"(JavascriptOperators::IsUndefinedObject(instance))",
                                      "JavascriptOperators::IsUndefinedObject(instance)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        DirectSetItemAt<void*>(this,needArraySlowCopy.jsReentLock._4_4_,pvVar7);
        needArraySlowCopy.jsReentLock._4_4_ = needArraySlowCopy.jsReentLock._4_4_ + 1;
      }
      if (spreadIndex < spreadIndices->count - 1) {
        spreadIndex = spreadIndex + 1;
      }
    }
    resultIndex = resultIndex + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::SpreadArrayArgs(Var arrayToSpread, const Js::AuxArray<uint32> *spreadIndices, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arrayToSpread);

        // At this stage we have an array literal with some arguments to be spread.
        // First we need to calculate the real size of the final literal.
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayToSpread);
#endif
        JavascriptArray *array = VarTo<JavascriptArray>(arrayToSpread);
        uint32 arrayLength = array->GetLength();
        uint32 actualLength = arrayLength;

        for (unsigned i = 0; i < spreadIndices->count; ++i)
        {
            JS_REENTRANT(jsReentLock,
                actualLength = UInt32Math::Add(actualLength - 1, GetSpreadArgLen(array->DirectGetItem(spreadIndices->elements[i]), scriptContext)));
        }

        JavascriptArray *result = VarTo<JavascriptArray>(OP_NewScArrayWithMissingValues(actualLength, scriptContext));

        // Now we copy each element and expand the spread parameters inline.
        for (unsigned i = 0, spreadArrIndex = 0, resultIndex = 0; i < arrayLength && resultIndex < actualLength; ++i)
        {
            uint32 spreadIndex = spreadIndices->elements[spreadArrIndex]; // The index of the next element to be spread.

            // An array needs a slow copy if it is a cross-site object or we have missing values that need to be set to undefined.
            auto needArraySlowCopy = [&](Var instance) {
                JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(instance);
                if (arr)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return arr->IsCrossSiteObject() || arr->IsFillFromPrototypes());
                }
                return false;
            };

            // Designed to have interchangeable arguments with CopyAnyArrayElementsToVar.
            auto slowCopy = [&scriptContext, &needArraySlowCopy
                ](JavascriptArray *dstArray, unsigned dstIndex, Var srcArray, uint32 start, uint32 end) {
                Assert(needArraySlowCopy(srcArray) || VarIs<ArgumentsObject>(srcArray) || VarIs<TypedArrayBase>(srcArray) || VarIs<JavascriptString>(srcArray));
                JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

                RecyclableObject *propertyObject;
                if (!JavascriptOperators::GetPropertyObject(srcArray, scriptContext, &propertyObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidSpreadArgument);
                }

                for (uint32 j = start; j < end; j++)
                {
                    Var element;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(srcArray, propertyObject, j, &element, scriptContext));
                    if (!gotItem)
                    {
                        // skip elided elements
                        dstIndex++;
                    }
                    else
                    {
                        dstArray->DirectSetItemAt(dstIndex++, element);
                    }
                }
            };

            if (i < spreadIndex)
            {
                // Any non-spread elements can be copied in bulk.

                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, (Var)array, i, spreadIndex);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, spreadIndex));
                }
                resultIndex += spreadIndex - i;
                i = spreadIndex - 1;
                continue;
            }
            else if (i > spreadIndex)
            {
                // Any non-spread elements terminating the array can also be copied in bulk.
                Assert(spreadArrIndex == spreadIndices->count - 1);
                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, array, i, arrayLength);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, arrayLength));
                }
                break;
            }
            else
            {
                JS_REENTRANT(jsReentLock, Var instance = array->DirectGetItem(i));

                if (VarIs<SpreadArgument>(instance))
                {
                    SpreadArgument* spreadArgument = VarTo<SpreadArgument>(instance);
                    uint32 len = spreadArgument->GetArgumentSpreadCount();
                    const Var*  spreadItems = spreadArgument->GetArgumentSpread();
                    for (uint32 j = 0; j < len; j++)
                    {
                        result->DirectSetItemAt(resultIndex++, spreadItems[j]);
                    }

                }
                else
                {
                    Assert(JavascriptOperators::IsUndefinedObject(instance));
                    result->DirectSetItemAt(resultIndex++, instance);
                }

                if (spreadArrIndex < spreadIndices->count - 1)
                {
                    spreadArrIndex++;
                }
            }
        }
        AssertMsg(arrayLength == array->GetLength(), "Array's length should not have changed");
        return result;
    }